

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall InterpGCTest::TearDown(InterpGCTest *this)

{
  char *message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  AssertHelper local_18;
  
  if ((this->super_InterpTest).inst_.obj_ != (Instance *)0x0) {
    wabt::interp::Store::DeleteRoot
              ((this->super_InterpTest).inst_.store_,(this->super_InterpTest).inst_.root_index_);
    (this->super_InterpTest).inst_.obj_ = (Instance *)0x0;
    (this->super_InterpTest).inst_.store_ = (Store *)0x0;
    (this->super_InterpTest).inst_.root_index_ = 0;
  }
  if ((this->super_InterpTest).mod_.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot
              ((this->super_InterpTest).mod_.store_,(this->super_InterpTest).mod_.root_index_);
    (this->super_InterpTest).mod_.obj_ = (Module *)0x0;
    (this->super_InterpTest).mod_.store_ = (Store *)0x0;
    (this->super_InterpTest).mod_.root_index_ = 0;
  }
  wabt::interp::Store::Collect(&(this->super_InterpTest).store_);
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)*(pointer *)
                ((long)&(this->super_InterpTest).store_.objects_.list_.
                        super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                        ._M_impl.super__Vector_impl_data + 8) -
         (long)(this->super_InterpTest).store_.objects_.list_.
               super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) -
       (this->super_InterpTest).store_.objects_.free_items_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_28,"before_new","store_.object_count()",&this->before_new,
             (unsigned_long *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x23f,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

void TearDown() override {
    // Reset instance and module, in case they were allocated.
    inst_.reset();
    mod_.reset();

    store_.Collect();
    EXPECT_EQ(before_new, store_.object_count());
  }